

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareUnknownFields
          (MessageDifferencer *this,Message *message1,Message *message2,
          UnknownFieldSet *unknown_field_set1,UnknownFieldSet *unknown_field_set2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_field)

{
  pointer *ppSVar1;
  uint32 uVar2;
  uint32 uVar3;
  pointer pUVar4;
  UnknownField *pUVar5;
  iterator iVar6;
  undefined1 auVar7 [8];
  pointer ppVar8;
  undefined1 auVar9 [8];
  bool bVar10;
  undefined1 uVar11;
  int iVar12;
  pointer pUVar13;
  ulong uVar14;
  ulong uVar15;
  UnknownField *pUVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  undefined1 auStack_e8 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields1;
  undefined1 auStack_c8 [8];
  vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
  fields2;
  undefined1 auStack_98 [8];
  _TmpBuf __buf;
  int local_70;
  int iStack_6c;
  int local_64;
  UnknownField *local_58;
  undefined4 local_3c;
  int local_38;
  int local_34;
  
  local_3c._0_1_ = 1;
  if (this->message_field_comparison_ != EQUIVALENT) {
    pUVar13 = (unknown_field_set1->fields_).
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pUVar4 = (unknown_field_set1->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pUVar13 != pUVar4) ||
       ((unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (unknown_field_set2->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      auStack_e8 = (undefined1  [8])0x0;
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fields1.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_c8 = (undefined1  [8])0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_e8,(long)(int)((ulong)((long)pUVar4 - (long)pUVar13) >> 4));
      std::
      vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ::reserve((vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 *)auStack_c8,
                (long)(int)((ulong)((long)(unknown_field_set2->fields_).
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(unknown_field_set2->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
      pUVar13 = (unknown_field_set1->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(unknown_field_set1->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) >> 4))
      {
        lVar18 = 0;
        lVar20 = 0;
        do {
          __buf._M_original_len = (long)&pUVar13->number_ + lVar18;
          auStack_98._0_4_ = (int)lVar20;
          if (fields1.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              fields1.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
            ::_M_realloc_insert<std::pair<int,google::protobuf::UnknownField_const*>>
                      ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                        *)auStack_e8,
                       (iterator)
                       fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<int,_const_google::protobuf::UnknownField_*> *)auStack_98);
          }
          else {
            (fields1.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = (int)lVar20;
            *(undefined4 *)
             &(fields1.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_98._4_4_;
            (fields1.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second =
                 (UnknownField *)__buf._M_original_len;
            fields1.
            super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 fields1.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar20 = lVar20 + 1;
          pUVar13 = (unknown_field_set1->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x10;
        } while (lVar20 < (int)((ulong)((long)(unknown_field_set1->fields_).
                                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pUVar13) >> 4));
      }
      pUVar13 = (unknown_field_set2->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(unknown_field_set2->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) >> 4))
      {
        lVar18 = 0;
        lVar20 = 0;
        do {
          __buf._M_original_len = (long)&pUVar13->number_ + lVar18;
          auStack_98._0_4_ = (int)lVar20;
          if (fields2.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              fields2.
              super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
            ::_M_realloc_insert<std::pair<int,google::protobuf::UnknownField_const*>>
                      ((vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>
                        *)auStack_c8,
                       (iterator)
                       fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pair<int,_const_google::protobuf::UnknownField_*> *)auStack_98);
          }
          else {
            (fields2.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first = (int)lVar20;
            *(undefined4 *)
             &(fields2.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = auStack_98._4_4_;
            (fields2.
             super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second =
                 (UnknownField *)__buf._M_original_len;
            fields2.
            super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 fields2.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar20 = lVar20 + 1;
          pUVar13 = (unknown_field_set2->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x10;
        } while (lVar20 < (int)((ulong)((long)(unknown_field_set2->fields_).
                                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pUVar13) >> 4));
      }
      ppVar8 = fields1.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar7 = auStack_e8;
      if (auStack_e8 !=
          (undefined1  [8])
          fields1.
          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar18 = (long)fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 4;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
                             *)auStack_98,
                            (__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>
                             )auStack_e8,(lVar18 - (lVar18 + 1 >> 0x3f)) + 1 >> 1);
        if (__buf._M_len == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar7,ppVar8);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,std::pair<int,google::protobuf::UnknownField_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar7,ppVar8,__buf._M_len,__buf._M_original_len);
        }
        operator_delete((void *)__buf._M_len);
      }
      ppVar8 = fields2.
               super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar7 = auStack_c8;
      if (auStack_c8 !=
          (undefined1  [8])
          fields2.
          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar18 = (long)fields2.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 4;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>,_std::pair<int,_const_google::protobuf::UnknownField_*>_>
                             *)auStack_98,
                            (__normal_iterator<std::pair<int,_const_google::protobuf::UnknownField_*>_*,_std::vector<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>_>
                             )auStack_c8,(lVar18 - (lVar18 + 1 >> 0x3f)) + 1 >> 1);
        if (__buf._M_len == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar7,ppVar8);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,google::protobuf::UnknownField_const*>*,std::vector<std::pair<int,google::protobuf::UnknownField_const*>,std::allocator<std::pair<int,google::protobuf::UnknownField_const*>>>>,std::pair<int,google::protobuf::UnknownField_const*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::util::(anonymous_namespace)::UnknownFieldOrdering>>
                    (auVar7,ppVar8,__buf._M_len,__buf._M_original_len);
        }
        operator_delete((void *)__buf._M_len);
      }
      ppSVar1 = &(parent_field->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      local_3c = SUB84(ppSVar1,0);
      local_58 = (UnknownField *)0x0;
      fields2.
      super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_64 = 0;
      local_38 = 0;
      local_34 = 0;
      do {
        auVar9 = auStack_c8;
        auVar7 = auStack_e8;
        uVar19 = (ulong)local_38;
        uVar14 = (long)fields1.
                       super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 4;
        uVar15 = (ulong)local_34;
        if ((uVar14 <= uVar19) &&
           ((ulong)((long)fields2.
                          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 4) <=
            uVar15)) {
          local_3c._0_1_ = 1;
          break;
        }
        if ((long)fields2.
                  super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_c8 >> 4 == uVar15) {
LAB_003318b5:
          pUVar16 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_e8 + uVar19 * 0x10))->second;
          uVar14 = 1;
          goto LAB_003318c7;
        }
        if (uVar19 < uVar14) {
          uVar2 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                  ((long)auStack_c8 + uVar15 * 0x10))->second->number_;
          uVar3 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                  ((long)auStack_e8 + uVar19 * 0x10))->second->number_;
          if (((int)uVar3 < (int)uVar2) ||
             (((int)uVar3 <= (int)uVar2 &&
              ((int)((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_e8 + uVar19 * 0x10))->second->type_ <
               (int)((pair<int,_const_google::protobuf::UnknownField_*> *)
                    ((long)auStack_c8 + uVar15 * 0x10))->second->type_)))) goto LAB_003318b5;
        }
        if (uVar14 == uVar19) {
LAB_00331976:
          if (this->scope_ != PARTIAL) {
            pUVar16 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                      ((long)auStack_c8 + uVar15 * 0x10))->second;
            uVar14 = 0;
            goto LAB_003318c7;
          }
          goto LAB_00331987;
        }
        pUVar5 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                 ((long)auStack_c8 + uVar15 * 0x10))->second;
        pUVar16 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                  ((long)auStack_e8 + uVar19 * 0x10))->second;
        if (((int)pUVar5->number_ < (int)pUVar16->number_) ||
           (((int)pUVar5->number_ <= (int)pUVar16->number_ &&
            ((int)pUVar5->type_ < (int)pUVar16->type_)))) goto LAB_00331976;
        uVar14 = 2;
        bVar10 = true;
        switch(pUVar16->type_) {
        case 0:
          if (pUVar5->type_ != 0) {
            __assert_fail("type() == TYPE_VARINT",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                          ,0x15a,"uint64 google::protobuf::UnknownField::varint() const");
          }
          break;
        case 1:
          if (pUVar5->type_ != 1) {
            __assert_fail("type() == TYPE_FIXED32",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                          ,0x15e,"uint32 google::protobuf::UnknownField::fixed32() const");
          }
          bVar21 = (pUVar16->data_).fixed32_ == (pUVar5->data_).fixed32_;
          goto LAB_00331d93;
        case 2:
          if (pUVar5->type_ != 2) {
            __assert_fail("type() == TYPE_FIXED64",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                          ,0x162,"uint64 google::protobuf::UnknownField::fixed64() const");
          }
          break;
        case 3:
          if (pUVar5->type_ != 3) {
            __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                          ,0x166,
                          "const std::string &google::protobuf::UnknownField::length_delimited() const"
                         );
          }
          pUVar13 = (((pUVar16->data_).group_)->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pUVar13 !=
              (((pUVar5->data_).group_)->fields_).
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto switchD_00331b82_default;
          bVar10 = true;
          if (pUVar13 != (pointer)0x0) {
            iVar12 = bcmp((((pUVar16->data_).group_)->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (((pUVar5->data_).group_)->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_start,(size_t)pUVar13);
            bVar21 = iVar12 == 0;
            goto LAB_00331d93;
          }
          bVar21 = true;
          goto LAB_00331d96;
        case 4:
          uVar14 = 3;
          bVar10 = false;
        default:
switchD_00331b82_default:
          bVar21 = false;
          goto LAB_00331d96;
        }
        bVar21 = (pUVar16->data_).varint_ == (pUVar5->data_).varint_;
LAB_00331d93:
        bVar10 = true;
LAB_00331d96:
        uVar17 = 4;
        if (!bVar21) {
          uVar17 = (uint)uVar14;
        }
        if (bVar10) {
          uVar14 = (ulong)uVar17;
        }
LAB_003318c7:
        if (((local_58 == (UnknownField *)0x0) || (pUVar16->number_ != local_58->number_)) ||
           (pUVar16->type_ != local_58->type_)) {
          fields2.
          super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_38;
          local_64 = local_34;
          local_58 = pUVar16;
        }
        uVar17 = (uint)uVar14;
        if ((uVar17 == 4) && (this->reporter_ == (Reporter *)0x0)) {
          local_38 = local_38 + 1;
LAB_00331987:
          local_34 = local_34 + 1;
          bVar10 = false;
        }
        else {
          auStack_98 = (undefined1  [8])0x0;
          __buf._M_original_len._0_4_ = pUVar16->number_;
          __buf._M_original_len._4_4_ = pUVar16->type_;
          if (uVar17 == 0) {
            iStack_6c = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                        ((long)auVar9 + uVar15 * 0x10))->first;
            local_70 = -1;
LAB_00331a4c:
            iVar12 = local_34 - local_64;
            __buf._M_len._0_4_ = iVar12;
          }
          else {
            iStack_6c = -1;
            local_70 = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                       ((long)auVar7 + uVar19 * 0x10))->first;
            if ((uVar17 != 1) &&
               (iStack_6c = ((pair<int,_const_google::protobuf::UnknownField_*> *)
                            ((long)auVar9 + uVar15 * 0x10))->first, uVar17 == 0)) goto LAB_00331a4c;
            iVar12 = local_34 - local_64;
            __buf._M_len._0_4_ =
                 local_38 -
                 fields2.
                 super__Vector_base<std::pair<int,_const_google::protobuf::UnknownField_*>,_std::allocator<std::pair<int,_const_google::protobuf::UnknownField_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          }
          __buf._M_len = CONCAT44(iVar12,(int)__buf._M_len);
          __buf._M_buffer = (pointer)unknown_field_set1;
          bVar10 = IsUnknownFieldIgnored
                             (this,message1,message2,(SpecificField *)auStack_98,parent_field);
          if (bVar10) {
            if (this->reporter_ == (Reporter *)0x0) {
              bVar10 = true;
              local_3c = 1;
            }
            else {
              iVar6._M_current =
                   (parent_field->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (parent_field->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_field,iVar6,(SpecificField *)auStack_98);
              }
              else {
                (iVar6._M_current)->unknown_field_set2 = unknown_field_set2;
                (iVar6._M_current)->unknown_field_index1 = local_70;
                (iVar6._M_current)->unknown_field_index2 = iStack_6c;
                (iVar6._M_current)->index = (int)__buf._M_len;
                (iVar6._M_current)->new_index = __buf._M_len._4_4_;
                (iVar6._M_current)->unknown_field_set1 = (UnknownFieldSet *)__buf._M_buffer;
                *(undefined4 *)&(iVar6._M_current)->field = auStack_98._0_4_;
                *(undefined4 *)((long)&(iVar6._M_current)->field + 4) = auStack_98._4_4_;
                (iVar6._M_current)->unknown_field_number = (int)__buf._M_original_len;
                (iVar6._M_current)->unknown_field_type = __buf._M_original_len._4_4_;
                *ppSVar1 = *ppSVar1 + 1;
              }
              (*this->reporter_->_vptr_Reporter[8])(this->reporter_,message1,message2,parent_field);
              bVar10 = true;
              local_3c = 1;
              *ppSVar1 = *ppSVar1 + -1;
            }
          }
          else {
            if ((2 < uVar17) || (this->reporter_ != (Reporter *)0x0)) {
              iVar6._M_current =
                   (parent_field->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (parent_field->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_field,iVar6,(SpecificField *)auStack_98);
                uVar11 = (*(code *)(&DAT_00361ef8 + *(int *)(&DAT_00361ef8 + uVar14 * 4)))();
                return (bool)uVar11;
              }
              (iVar6._M_current)->unknown_field_set2 = unknown_field_set2;
              (iVar6._M_current)->unknown_field_index1 = local_70;
              (iVar6._M_current)->unknown_field_index2 = iStack_6c;
              (iVar6._M_current)->index = (int)__buf._M_len;
              (iVar6._M_current)->new_index = __buf._M_len._4_4_;
              *(undefined4 *)&(iVar6._M_current)->unknown_field_set1 = __buf._M_buffer._0_4_;
              *(undefined4 *)((long)&(iVar6._M_current)->unknown_field_set1 + 4) =
                   __buf._M_buffer._4_4_;
              *(undefined4 *)&(iVar6._M_current)->field = auStack_98._0_4_;
              *(undefined4 *)((long)&(iVar6._M_current)->field + 4) = auStack_98._4_4_;
              (iVar6._M_current)->unknown_field_number = (int)__buf._M_original_len;
              (iVar6._M_current)->unknown_field_type = __buf._M_original_len._4_4_;
              *ppSVar1 = *ppSVar1 + 1;
              uVar11 = (*(code *)(&DAT_00361ef8 + *(int *)(&DAT_00361ef8 + uVar14 * 4)))();
              return (bool)uVar11;
            }
            bVar10 = true;
            local_3c = 0;
          }
        }
      } while (!bVar10);
      if (auStack_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_c8);
      }
      if (auStack_e8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_e8);
      }
    }
  }
  return (bool)((byte)local_3c & 1);
}

Assistant:

bool MessageDifferencer::CompareUnknownFields(
    const Message& message1, const Message& message2,
    const UnknownFieldSet& unknown_field_set1,
    const UnknownFieldSet& unknown_field_set2,
    std::vector<SpecificField>* parent_field) {
  // Ignore unknown fields in EQUIVALENT mode.
  if (message_field_comparison_ == EQUIVALENT) return true;

  if (unknown_field_set1.empty() && unknown_field_set2.empty()) {
    return true;
  }

  bool is_different = false;

  // We first sort the unknown fields by field number and type (in other words,
  // in tag order), making sure to preserve ordering of values with the same
  // tag.  This allows us to report only meaningful differences between the
  // two sets -- that is, differing values for the same tag.  We use
  // IndexUnknownFieldPairs to keep track of the field's original index for
  // reporting purposes.
  std::vector<IndexUnknownFieldPair> fields1;  // unknown_field_set1, sorted
  std::vector<IndexUnknownFieldPair> fields2;  // unknown_field_set2, sorted
  fields1.reserve(unknown_field_set1.field_count());
  fields2.reserve(unknown_field_set2.field_count());

  for (int i = 0; i < unknown_field_set1.field_count(); i++) {
    fields1.push_back(std::make_pair(i, &unknown_field_set1.field(i)));
  }
  for (int i = 0; i < unknown_field_set2.field_count(); i++) {
    fields2.push_back(std::make_pair(i, &unknown_field_set2.field(i)));
  }

  UnknownFieldOrdering is_before;
  std::stable_sort(fields1.begin(), fields1.end(), is_before);
  std::stable_sort(fields2.begin(), fields2.end(), is_before);

  // In order to fill in SpecificField::index, we have to keep track of how
  // many values we've seen with the same field number and type.
  // current_repeated points at the first field in this range, and
  // current_repeated_start{1,2} are the indexes of the first field in the
  // range within fields1 and fields2.
  const UnknownField* current_repeated = NULL;
  int current_repeated_start1 = 0;
  int current_repeated_start2 = 0;

  // Now that we have two sorted lists, we can detect fields which appear only
  // in one list or the other by traversing them simultaneously.
  int index1 = 0;
  int index2 = 0;
  while (index1 < fields1.size() || index2 < fields2.size()) {
    enum {
      ADDITION,
      DELETION,
      MODIFICATION,
      COMPARE_GROUPS,
      NO_CHANGE
    } change_type;

    // focus_field is the field we're currently reporting on.  (In the case
    // of a modification, it's the field on the left side.)
    const UnknownField* focus_field;
    bool match = false;

    if (index2 == fields2.size() ||
        (index1 < fields1.size() &&
         is_before(fields1[index1], fields2[index2]))) {
      // fields1[index1] is not present in fields2.
      change_type = DELETION;
      focus_field = fields1[index1].second;
    } else if (index1 == fields1.size() ||
               is_before(fields2[index2], fields1[index1])) {
      // fields2[index2] is not present in fields1.
      if (scope_ == PARTIAL) {
        // Ignore.
        ++index2;
        continue;
      }
      change_type = ADDITION;
      focus_field = fields2[index2].second;
    } else {
      // Field type and number are the same.  See if the values differ.
      change_type = MODIFICATION;
      focus_field = fields1[index1].second;

      switch (focus_field->type()) {
        case UnknownField::TYPE_VARINT:
          match = fields1[index1].second->varint() ==
                  fields2[index2].second->varint();
          break;
        case UnknownField::TYPE_FIXED32:
          match = fields1[index1].second->fixed32() ==
                  fields2[index2].second->fixed32();
          break;
        case UnknownField::TYPE_FIXED64:
          match = fields1[index1].second->fixed64() ==
                  fields2[index2].second->fixed64();
          break;
        case UnknownField::TYPE_LENGTH_DELIMITED:
          match = fields1[index1].second->length_delimited() ==
                  fields2[index2].second->length_delimited();
          break;
        case UnknownField::TYPE_GROUP:
          // We must deal with this later, after building the SpecificField.
          change_type = COMPARE_GROUPS;
          break;
      }
      if (match && change_type != COMPARE_GROUPS) {
        change_type = NO_CHANGE;
      }
    }

    if (current_repeated == NULL ||
        focus_field->number() != current_repeated->number() ||
        focus_field->type() != current_repeated->type()) {
      // We've started a new repeated field.
      current_repeated = focus_field;
      current_repeated_start1 = index1;
      current_repeated_start2 = index2;
    }

    if (change_type == NO_CHANGE && reporter_ == NULL) {
      // Fields were already compared and matched and we have no reporter.
      ++index1;
      ++index2;
      continue;
    }

    // Build the SpecificField.  This is slightly complicated.
    SpecificField specific_field;
    specific_field.unknown_field_number = focus_field->number();
    specific_field.unknown_field_type = focus_field->type();

    specific_field.unknown_field_set1 = &unknown_field_set1;
    specific_field.unknown_field_set2 = &unknown_field_set2;

    if (change_type != ADDITION) {
      specific_field.unknown_field_index1 = fields1[index1].first;
    }
    if (change_type != DELETION) {
      specific_field.unknown_field_index2 = fields2[index2].first;
    }

    // Calculate the field index.
    if (change_type == ADDITION) {
      specific_field.index = index2 - current_repeated_start2;
      specific_field.new_index = index2 - current_repeated_start2;
    } else {
      specific_field.index = index1 - current_repeated_start1;
      specific_field.new_index = index2 - current_repeated_start2;
    }

    if (IsUnknownFieldIgnored(message1, message2, specific_field,
                              *parent_field)) {
      if (reporter_ != NULL) {
        parent_field->push_back(specific_field);
        reporter_->ReportUnknownFieldIgnored(message1, message2, *parent_field);
        parent_field->pop_back();
      }
      return true;
    }

    if (change_type == ADDITION || change_type == DELETION ||
        change_type == MODIFICATION) {
      if (reporter_ == NULL) {
        // We found a difference and we have no reporter.
        return false;
      }
      is_different = true;
    }

    parent_field->push_back(specific_field);

    switch (change_type) {
      case ADDITION:
        reporter_->ReportAdded(message1, message2, *parent_field);
        ++index2;
        break;
      case DELETION:
        reporter_->ReportDeleted(message1, message2, *parent_field);
        ++index1;
        break;
      case MODIFICATION:
        reporter_->ReportModified(message1, message2, *parent_field);
        ++index1;
        ++index2;
        break;
      case COMPARE_GROUPS:
        if (!CompareUnknownFields(
                message1, message2, fields1[index1].second->group(),
                fields2[index2].second->group(), parent_field)) {
          if (reporter_ == NULL) return false;
          is_different = true;
          reporter_->ReportModified(message1, message2, *parent_field);
        }
        ++index1;
        ++index2;
        break;
      case NO_CHANGE:
        ++index1;
        ++index2;
        if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_field);
        }
    }

    parent_field->pop_back();
  }

  return !is_different;
}